

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall
phosg::Image::blend_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          uint64_t source_alpha)

{
  long lVar1;
  bool bVar2;
  uint64_t a;
  ulong r;
  long lVar3;
  long lVar4;
  ulong g;
  ulong b;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  uint64_t da;
  uint64_t db;
  uint64_t dg;
  uint64_t dr;
  uint64_t sa;
  long local_b8;
  uint64_t local_a0;
  uint64_t local_98;
  uint64_t local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  Image *local_68;
  ssize_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  lVar1 = source->width;
  lVar8 = source->height;
  if (w < 0) {
    w = lVar1;
  }
  if (h < 0) {
    h = lVar8;
  }
  uVar5 = sx >> 0x3f & sx;
  local_78 = x - uVar5;
  lVar9 = 0;
  if (sx < 1) {
    sx = lVar9;
  }
  uVar6 = sy >> 0x3f & sy;
  local_70 = y - uVar6;
  if (sy < 1) {
    sy = lVar9;
  }
  local_80 = 0;
  if (0 < local_78) {
    local_80 = local_78;
  }
  if (-1 < local_78) {
    local_78 = lVar9;
  }
  uVar5 = uVar5 + w + local_78;
  local_78 = sx - local_78;
  local_88 = 0;
  if (0 < local_70) {
    local_88 = local_70;
  }
  if (-1 < local_70) {
    local_70 = lVar9;
  }
  uVar7 = uVar6 + h + local_70;
  local_70 = sy - local_70;
  uVar6 = lVar1 - local_78;
  if ((long)(uVar5 + local_78) <= lVar1) {
    uVar6 = uVar5;
  }
  uVar5 = lVar8 - local_70;
  if ((long)(uVar7 + local_70) <= lVar8) {
    uVar5 = uVar7;
  }
  uVar7 = this->width - local_80;
  if ((long)(uVar6 + local_80) <= this->width) {
    uVar7 = uVar6;
  }
  uVar6 = this->height - local_88;
  if ((long)(uVar5 + local_88) <= this->height) {
    uVar6 = uVar5;
  }
  bVar10 = -1 < (long)(uVar7 | uVar6);
  if ((bVar10) && (0 < (long)uVar6)) {
    local_b8 = 0;
    local_68 = source;
    do {
      if (0 < (long)uVar7 && -1 < (long)uVar6) {
        local_60 = local_70 + local_b8;
        lVar1 = local_b8 + local_88;
        lVar3 = 1;
        lVar8 = local_78;
        lVar9 = local_80;
        do {
          read_pixel(local_68,lVar8,local_60,&local_90,&local_98,&local_a0,&local_38);
          uVar5 = this->max_value;
          a = (local_38 * source_alpha) / uVar5;
          r = local_90;
          g = local_98;
          b = local_a0;
          if (a == uVar5) {
LAB_00113a6c:
            write_pixel(this,lVar9,lVar1,r,g,b,a);
          }
          else if (uVar5 <= local_38 * source_alpha) {
            read_pixel(this,lVar9,lVar1,&local_40,&local_48,&local_50,&local_58);
            uVar5 = this->max_value;
            lVar4 = uVar5 - a;
            r = (local_40 * lVar4 + local_90 * a) / uVar5;
            g = (local_48 * lVar4 + local_98 * a) / uVar5;
            b = (lVar4 * local_50 + local_a0 * a) / uVar5;
            a = local_58;
            goto LAB_00113a6c;
          }
          bVar2 = lVar3 < (long)uVar7;
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 1;
          lVar3 = lVar3 + 1;
        } while (bVar10 && bVar2);
      }
      local_b8 = local_b8 + 1;
    } while (bVar10 && local_b8 < (long)uVar6);
  }
  return;
}

Assistant:

void Image::blend_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, uint64_t source_alpha) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t sr, sg, sb, sa;
      source.read_pixel(sx + xx, sy + yy, &sr, &sg, &sb, &sa);

      uint64_t effective_alpha = (source_alpha * sa) / this->max_value;
      if (effective_alpha == this->max_value) {
        this->write_pixel(x + xx, y + yy, sr, sg, sb, effective_alpha);
      } else if (effective_alpha != 0x00) {
        uint64_t dr, dg, db, da;
        this->read_pixel(x + xx, y + yy, &dr, &dg, &db, &da);
        this->write_pixel(x + xx, y + yy,
            (sr * effective_alpha + dr * (this->max_value - effective_alpha)) / this->max_value,
            (sg * effective_alpha + dg * (this->max_value - effective_alpha)) / this->max_value,
            (sb * effective_alpha + db * (this->max_value - effective_alpha)) / this->max_value,
            da);
      }
    }
  }
}